

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Catch * __thiscall Catch::toString(Catch *this,string *value)

{
  uint uVar1;
  IContext *pIVar2;
  IConfig *pIVar3;
  ulong uVar4;
  char *pcVar5;
  string local_118 [32];
  string local_f8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  string local_78 [8];
  string subs;
  ulong local_58;
  size_t i;
  Ptr<const_Catch::IConfig> local_40;
  string local_38 [8];
  string s;
  string *value_local;
  
  std::__cxx11::string::string(local_38,(string *)value);
  pIVar2 = getCurrentContext();
  (*pIVar2->_vptr_IContext[6])(&local_40);
  pIVar3 = Ptr<const_Catch::IConfig>::operator->(&local_40);
  uVar1 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])();
  Ptr<const_Catch::IConfig>::~Ptr(&local_40);
  if ((uVar1 & 1) != 0) {
    for (local_58 = 0; uVar4 = std::__cxx11::string::size(), local_58 < uVar4;
        local_58 = local_58 + 1) {
      std::__cxx11::string::string(local_78);
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
      if (*pcVar5 == '\t') {
        std::__cxx11::string::operator=(local_78,"\\t");
      }
      else if (*pcVar5 == '\n') {
        std::__cxx11::string::operator=(local_78,"\\n");
      }
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        std::__cxx11::string::substr((ulong)local_d8,(ulong)local_38);
        std::operator+(local_b8,local_d8);
        std::__cxx11::string::substr((ulong)local_f8,(ulong)local_38);
        std::operator+(local_98,local_b8);
        std::__cxx11::string::operator=(local_38,(string *)local_98);
        std::__cxx11::string::~string((string *)local_98);
        std::__cxx11::string::~string(local_f8);
        std::__cxx11::string::~string((string *)local_b8);
        std::__cxx11::string::~string((string *)local_d8);
        local_58 = local_58 + 1;
      }
      std::__cxx11::string::~string(local_78);
    }
  }
  std::operator+((char *)local_118,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x232658);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                 (char *)local_118);
  std::__cxx11::string::~string(local_118);
  std::__cxx11::string::~string(local_38);
  return this;
}

Assistant:

std::string toString( std::string const& value ) {
    std::string s = value;
    if( getCurrentContext().getConfig()->showInvisibles() ) {
        for(size_t i = 0; i < s.size(); ++i ) {
            std::string subs;
            switch( s[i] ) {
            case '\n': subs = "\\n"; break;
            case '\t': subs = "\\t"; break;
            default: break;
            }
            if( !subs.empty() ) {
                s = s.substr( 0, i ) + subs + s.substr( i+1 );
                ++i;
            }
        }
    }
    return "\"" + s + "\"";
}